

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dump_conspage(conspage *base,int linking)

{
  LispPTR LVar1;
  ulong uVar2;
  conspage *NAddr;
  
  while( true ) {
    LVar1 = LAddrFromNative(base);
    printf("conspage at 0x%x(lisp) has %d free cells , next available cell offset is %d ,and next page is 0x%x(lisp)\n"
           ,(ulong)LVar1,(ulong)(*(uint *)&base->field_0x8 >> 0x18),
           (ulong)(*(uint *)&base->field_0x8 >> 0x10 & 0xff),(ulong)base->next_page);
    uVar2 = 1;
    NAddr = base;
    while( true ) {
      NAddr = (conspage *)&NAddr->cell4;
      if ((int)uVar2 == 0x80) break;
      LVar1 = LAddrFromNative(NAddr);
      printf(" LADDR : %d = Cell[ %d ]## cdr_code= %d ,car = %d\n",(ulong)LVar1,uVar2,
             (ulong)(*(uint *)NAddr >> 0x1c),(ulong)(*(uint *)NAddr & 0xfffffff));
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    if ((linking != 1) || (base->next_page == 0)) break;
    base = (conspage *)(Lisp_world + (base->next_page << 8));
  }
  return;
}

Assistant:

void dump_conspage(struct conspage *base, int linking)
/* target conspage address */
/* look for chaining conspage ? T/NIL */
{
  ConsCell *cell;
  int i;

lp:
  printf(
      "conspage at 0x%x(lisp) has %d free cells , next available cell offset is %d ,and next page "
      "is 0x%x(lisp)\n",
      LAddrFromNative(base), (0xff & base->count), (0xff & base->next_cell), base->next_page);

  for (i = 0, cell = (ConsCell *)base + 1; i < 127; i++, cell++) {
    printf(" LADDR : %d = Cell[ %d ]## cdr_code= %d ,car = %d\n", LAddrFromNative(cell), i + 1,
           cell->cdr_code, cell->car_field);
  }

  if ((linking == T) && (base->next_page != NIL_PTR)) {
    base = (struct conspage *)NativeAligned4FromLPage(base->next_page);
    goto lp;
  }

}